

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O0

void __thiscall GPIOClass::GPIOClass(GPIOClass *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator=(in_RDI,"4");
  return;
}

Assistant:

GPIOClass::GPIOClass()
{
    this->gpionum = "4"; //GPIO4 is default
}